

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2padded_cell.cc
# Opt level: O0

void __thiscall S2PaddedCell::S2PaddedCell(S2PaddedCell *this,S2CellId id,double padding)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined1 local_f0 [4];
  int ij_size;
  R2Rect local_d0;
  uint local_b0;
  uint local_ac;
  int ij [2];
  R1Interval local_98;
  R2Rect local_88;
  R1Interval local_68;
  R1Interval local_58;
  R2Rect local_48;
  double local_28;
  double limit;
  double padding_local;
  S2PaddedCell *this_local;
  S2CellId id_local;
  
  (this->id_).id_ = id.id_;
  this->padding_ = padding;
  limit = padding;
  padding_local = (double)this;
  this_local = (S2PaddedCell *)id.id_;
  R2Rect::R2Rect(&this->bound_);
  R2Rect::R2Rect(&this->middle_);
  bVar1 = S2CellId::is_face(&this->id_);
  if (bVar1) {
    local_28 = limit + 1.0;
    R1Interval::R1Interval(&local_58,-local_28,local_28);
    R1Interval::R1Interval(&local_68,-local_28,local_28);
    R2Rect::R2Rect(&local_48,&local_58,&local_68);
    (this->bound_).bounds_[0].bounds_.c_[0] = local_48.bounds_[0].bounds_.c_[0];
    (this->bound_).bounds_[0].bounds_.c_[1] = local_48.bounds_[0].bounds_.c_[1];
    (this->bound_).bounds_[1].bounds_.c_[0] = local_48.bounds_[1].bounds_.c_[0];
    (this->bound_).bounds_[1].bounds_.c_[1] = local_48.bounds_[1].bounds_.c_[1];
    R1Interval::R1Interval(&local_98,-limit,limit);
    R1Interval::R1Interval((R1Interval *)ij,-limit,limit);
    R2Rect::R2Rect(&local_88,&local_98,(R1Interval *)ij);
    (this->middle_).bounds_[0].bounds_.c_[0] = local_88.bounds_[0].bounds_.c_[0];
    (this->middle_).bounds_[0].bounds_.c_[1] = local_88.bounds_[0].bounds_.c_[1];
    (this->middle_).bounds_[1].bounds_.c_[0] = local_88.bounds_[1].bounds_.c_[0];
    (this->middle_).bounds_[1].bounds_.c_[1] = local_88.bounds_[1].bounds_.c_[1];
    this->ij_lo_[1] = 0;
    this->ij_lo_[0] = 0;
    uVar2 = S2CellId::face(&this->id_);
    this->orientation_ = uVar2 & 1;
    this->level_ = 0;
  }
  else {
    S2CellId::ToFaceIJOrientation
              ((S2CellId *)&this_local,(int *)&local_b0,(int *)&local_ac,&this->orientation_);
    iVar3 = S2CellId::level((S2CellId *)&this_local);
    this->level_ = iVar3;
    S2CellId::IJLevelToBoundUV((R2Rect *)local_f0,(int *)&local_b0,this->level_);
    R2Rect::Expanded(&local_d0,(R2Rect *)local_f0,limit);
    (this->bound_).bounds_[0].bounds_.c_[0] = local_d0.bounds_[0].bounds_.c_[0];
    (this->bound_).bounds_[0].bounds_.c_[1] = local_d0.bounds_[0].bounds_.c_[1];
    (this->bound_).bounds_[1].bounds_.c_[0] = local_d0.bounds_[1].bounds_.c_[0];
    (this->bound_).bounds_[1].bounds_.c_[1] = local_d0.bounds_[1].bounds_.c_[1];
    iVar3 = S2CellId::GetSizeIJ(this->level_);
    this->ij_lo_[0] = local_b0 & -iVar3;
    this->ij_lo_[1] = local_ac & -iVar3;
  }
  return;
}

Assistant:

S2PaddedCell::S2PaddedCell(S2CellId id, double padding)
    : id_(id), padding_(padding) {
  if (id_.is_face()) {
    // Fast path for constructing a top-level face (the most common case).
    double limit = 1 + padding;
    bound_ = R2Rect(R1Interval(-limit, limit), R1Interval(-limit, limit));
    middle_ = R2Rect(R1Interval(-padding, padding),
                     R1Interval(-padding, padding));
    ij_lo_[0] = ij_lo_[1] = 0;
    orientation_ = id_.face() & 1;
    level_ = 0;
  } else {
    int ij[2];
    id.ToFaceIJOrientation(&ij[0], &ij[1], &orientation_);
    level_ = id.level();
    bound_ = S2CellId::IJLevelToBoundUV(ij, level_).Expanded(padding);
    int ij_size = S2CellId::GetSizeIJ(level_);
    ij_lo_[0] = ij[0] & -ij_size;
    ij_lo_[1] = ij[1] & -ij_size;
  }
}